

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# armci.c
# Opt level: O2

void * PARMCI_Memat(armci_meminfo_t *meminfo,long offset)

{
  int rank;
  int local_c;
  
  comex_group_rank(0,&local_c);
  if (meminfo == (armci_meminfo_t *)0x0) {
    comex_error("PARMCI_Memat: Invalid arg #1 (NULL ptr)",0);
  }
  return meminfo->addr;
}

Assistant:

void* PARMCI_Memat(armci_meminfo_t *meminfo, long offset)
{
    void *ptr=NULL;
    int rank;

    comex_group_rank(COMEX_GROUP_WORLD, &rank);

    if(meminfo==NULL) comex_error("PARMCI_Memat: Invalid arg #1 (NULL ptr)",0);

    if(meminfo->cpid==rank) { ptr = meminfo->addr; return ptr; }

    ptr = meminfo->addr;

    return ptr;
}